

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
CopyNodes(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
          *this,Node *nodes,hash_t numnodes)

{
  undefined8 in_RAX;
  Node *pNVar1;
  FOptionalMapinfoDataPtr *p;
  bool bVar2;
  undefined8 uStack_28;
  
  p = &(nodes->Pair).Value;
  uStack_28 = in_RAX;
  while (bVar2 = numnodes != 0, numnodes = numnodes - 1, bVar2) {
    if (*(long *)(p + -2) != 1) {
      uStack_28 = CONCAT44((((IPair *)(p + -1))->Key).Index,(undefined4)uStack_28);
      pNVar1 = NewKey(this,(FName *)((long)&uStack_28 + 4));
      FOptionalMapinfoDataPtr::FOptionalMapinfoDataPtr(&(pNVar1->Pair).Value,p);
    }
    p = p + 3;
  }
  return;
}

Assistant:

void CopyNodes(const Node *nodes, hash_t numnodes)
	{
		for (; numnodes-- > 0; ++nodes)
		{
			if (!nodes->IsNil())
			{
				Node *n = NewKey(nodes->Pair.Key);
				::new(&n->Pair.Value) VT(nodes->Pair.Value);
			}
		}
	}